

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O0

void __thiscall ktx::PrintIndent::operator()(PrintIndent *this,int depth,char (*fmt) [3])

{
  format_string<const_char_(&)[1],_int> fmt_00;
  int iVar1;
  size_t sVar2;
  int in_ESI;
  char (*in_RDI) [1];
  undefined4 in_stack_ffffffffffffff80;
  basic_string_view<char> in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  char (*args) [1];
  char *os;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = &stack0xffffffffffffff88;
  os = "{:{}}";
  pcVar4 = "{:{}}";
  args = in_RDI;
  sVar2 = std::char_traits<char>::length((char_type *)0x17fc02);
  iVar1 = *(int *)(in_RDI + 0xc) * (*(int *)(in_RDI + 8) + in_ESI);
  fmt_00.str_.size_ = (size_t)pcVar4;
  fmt_00.str_.data_ = pcVar3;
  ::fmt::v10::print<char_const(&)[1],int>
            ((ostream *)os,fmt_00,args,(int *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0));
  std::char_traits<char>::length((char_type *)0x17fcbc);
  ::fmt::v10::print<>((ostream *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                      (format_string<>)in_stack_ffffffffffffff88);
  return;
}

Assistant:

inline void operator()(int depth, Fmt&& fmt, Args&&... args) {
        fmt::print(os, "{:{}}", "", indentWidth * (indentBase + depth));
        fmt::print(os, std::forward<Fmt>(fmt), std::forward<Args>(args)...);
    }